

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::FileDescriptorToBase64_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,FileDescriptor *descriptor)

{
  undefined1 local_110 [8];
  FileDescriptorProto fdp;
  string fdp_bytes;
  FileDescriptor *descriptor_local;
  
  std::__cxx11::string::string((string *)&fdp.source_code_info_);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_110);
  FileDescriptor::CopyTo((FileDescriptor *)this,(FileDescriptorProto *)local_110);
  MessageLite::SerializeToString((MessageLite *)local_110,(string *)&fdp.source_code_info_);
  StringToBase64(__return_storage_ptr__,(string *)&fdp.source_code_info_);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_110);
  std::__cxx11::string::~string((string *)&fdp.source_code_info_);
  return __return_storage_ptr__;
}

Assistant:

std::string FileDescriptorToBase64(const FileDescriptor* descriptor) {
  std::string fdp_bytes;
  FileDescriptorProto fdp;
  descriptor->CopyTo(&fdp);
  fdp.SerializeToString(&fdp_bytes);
  return StringToBase64(fdp_bytes);
}